

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::GetSortKeyLengthList<duckdb::SortKeyArrayEntry>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  pointer puVar1;
  sel_t *psVar2;
  SortKeyChunk chunk_00;
  reference this;
  type vector_data_00;
  idx_t iVar3;
  ulong row_idx;
  ulong uVar4;
  list_entry_t lVar5;
  undefined7 uStack_37;
  
  this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
         ::get<true>(&vector_data->child_data,0);
  for (iVar3 = chunk.start; iVar3 < chunk.end; iVar3 = iVar3 + 1) {
    psVar2 = ((vector_data->format).sel)->sel_vector;
    row_idx = iVar3;
    if (psVar2 != (sel_t *)0x0) {
      row_idx = (ulong)psVar2[iVar3];
    }
    uVar4 = iVar3;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar4 = chunk.result_index;
    }
    puVar1 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4;
    *puVar1 = *puVar1 + 1;
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,row_idx);
    lVar5 = SortKeyArrayEntry::GetListEntry(vector_data,row_idx);
    puVar1 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4;
    *puVar1 = *puVar1 + 1;
    if (lVar5.length != 0) {
      vector_data_00 =
           unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
           ::operator*(this);
      chunk_00._25_7_ = uStack_37;
      chunk_00.has_result_index = true;
      chunk_00.end = lVar5.length + lVar5.offset;
      chunk_00.start = lVar5.offset;
      chunk_00.result_index = uVar4;
      GetSortKeyLengthRecursive(vector_data_00,chunk_00,result);
    }
  }
  return;
}

Assistant:

void GetSortKeyLengthList(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &child_data = vector_data.child_data[0];
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = vector_data.format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every list is prefixed by a validity byte

		if (!vector_data.format.validity.RowIsValid(idx)) {
			if (!OP::IsArray()) {
				// for arrays we need to fill in the child vector for all elements, even if the top-level array is NULL
				continue;
			}
		}
		auto list_entry = OP::GetListEntry(vector_data, idx);
		// for each non-null list we have an "end of list" delimiter
		result.variable_lengths[result_index]++;
		if (list_entry.length > 0) {
			// recursively call GetSortKeyLength for the children of this list
			SortKeyChunk child_chunk(list_entry.offset, list_entry.offset + list_entry.length, result_index);
			GetSortKeyLengthRecursive(*child_data, child_chunk, result);
		}
	}
}